

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

void Fxu_HeapSingleCheck(Fxu_HeapSingle *p)

{
  Fxu_Single *pSingle;
  int iVar1;
  
  iVar1 = 1;
  while( true ) {
    p->i = iVar1;
    if ((p->nItems < iVar1) || (pSingle = p->pTree[iVar1], pSingle == (Fxu_Single *)0x0)) break;
    if (pSingle->HNum != iVar1) {
      __assert_fail("pSingle->HNum == p->i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuHeapS.c"
                    ,0xa0,"void Fxu_HeapSingleCheck(Fxu_HeapSingle *)");
    }
    Fxu_HeapSingleCheckOne(p,pSingle);
    iVar1 = p->i + 1;
  }
  return;
}

Assistant:

void Fxu_HeapSingleCheck( Fxu_HeapSingle * p )
{
	Fxu_Single * pSingle;
	Fxu_HeapSingleForEachItem( p, pSingle )
	{
		assert( pSingle->HNum == p->i );
        Fxu_HeapSingleCheckOne( p, pSingle );
	}
}